

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,int iCursor,int isLeftJoin)

{
  long lVar1;
  int iVar2;
  Expr *pEVar3;
  int in_ECX;
  Select *in_RDX;
  Parse *in_RSI;
  Expr *in_RDI;
  int in_R8D;
  SubstContext x;
  int nChng;
  Expr *pNew;
  Expr *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  sqlite3 *in_stack_ffffffffffffffc0;
  int local_34;
  undefined8 in_stack_ffffffffffffffd0;
  int local_4;
  
  local_34 = 0;
  if (in_RDX == (Select *)0x0) {
    local_4 = 0;
  }
  else if (((ulong)in_RSI->zErrMsg & 0x200000000000) == 0) {
    lVar1._0_4_ = in_RSI->writeMask;
    lVar1._4_4_ = in_RSI->cookieMask;
    if (lVar1 == 0) {
      if ((in_RSI->constraintName).z == (char *)0x0) {
        for (; *(char *)&in_RDX->pEList == ','; in_RDX = *(Select **)&in_RDX->iLimit) {
          iVar2 = pushDownWhereTerms(in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,in_R8D),
                                     (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                                     (int)in_stack_ffffffffffffffd0);
          local_34 = iVar2 + local_34;
        }
        if ((in_R8D == 0) ||
           ((((ulong)in_RDX->pEList & 0x100000000) != 0 &&
            (*(short *)((long)&in_RDX->pWhere + 4) == in_ECX)))) {
          if ((((ulong)in_RDX->pEList & 0x100000000) == 0) ||
             (*(short *)((long)&in_RDX->pWhere + 4) == in_ECX)) {
            iVar2 = sqlite3ExprIsTableConstant
                              ((Expr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                               ,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
            if (iVar2 != 0) {
              local_34 = local_34 + 1;
              for (; iVar2 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20), in_RSI != (Parse *)0x0
                  ; in_RSI = (Parse *)in_RSI->aLabel) {
                sqlite3ExprDup(in_stack_ffffffffffffffc0,
                               (Expr *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                               ,in_stack_ffffffffffffffb4);
                pEVar3 = (Expr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
                in_stack_ffffffffffffffb0 = in_ECX;
                unsetJoinExpr(pEVar3,iVar2);
                in_stack_ffffffffffffffb8 = 0;
                in_stack_ffffffffffffffc0 = in_RSI->db;
                in_stack_ffffffffffffffa8 = in_RDI;
                in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb0;
                in_ECX = in_stack_ffffffffffffffb0;
                substExpr((SubstContext *)x._8_8_,(Expr *)x.pParse);
                if (((ulong)in_RSI->zErrMsg & 0x800000000) == 0) {
                  pEVar3 = sqlite3ExprAnd((sqlite3 *)
                                          CONCAT44(in_stack_ffffffffffffffbc,
                                                   in_stack_ffffffffffffffb8),
                                          (Expr *)CONCAT44(in_stack_ffffffffffffffb4,
                                                           in_stack_ffffffffffffffb0),
                                          in_stack_ffffffffffffffa8);
                  *(Expr **)&in_RSI->nErr = pEVar3;
                }
                else {
                  pEVar3 = sqlite3ExprAnd((sqlite3 *)
                                          CONCAT44(in_stack_ffffffffffffffbc,
                                                   in_stack_ffffffffffffffb8),
                                          (Expr *)CONCAT44(in_stack_ffffffffffffffb4,
                                                           in_stack_ffffffffffffffb0),
                                          in_stack_ffffffffffffffa8);
                  *(Expr **)&in_RSI->szOpAlloc = pEVar3;
                }
              }
            }
            local_4 = local_34;
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  int iCursor,          /* Cursor number of the subquery */
  int isLeftJoin        /* True if pSubq is the right term of a LEFT JOIN */
){
  Expr *pNew;
  int nChng = 0;
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & SF_Recursive ) return 0;  /* restriction (2) */

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( pSubq->pWin ) return 0;    /* restriction (6) */
#endif

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;  
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight,
                                iCursor, isLeftJoin);
    pWhere = pWhere->pLeft;
  }
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_FromJoin)==0
         || pWhere->iRightJoinTable!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_FromJoin) && pWhere->iRightJoinTable!=iCursor ){
    return 0; /* restriction (5) */
  }
  if( sqlite3ExprIsTableConstant(pWhere, iCursor) ){
    nChng++;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1);
      x.pParse = pParse;
      x.iTable = iCursor;
      x.iNewTable = iCursor;
      x.isLeftJoin = 0;
      x.pEList = pSubq->pEList;
      pNew = substExpr(&x, pNew);
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse->db, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse->db, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}